

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O1

void btDbvt::rayTest(btDbvtNode *root,btVector3 *rayFrom,btVector3 *rayTo,ICollide *policy)

{
  btDbvtNode *pbVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int i;
  uint uVar4;
  btDbvtNode **ppbVar5;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  float fVar26;
  btAlignedObjectArray<const_btDbvtNode_*> stack;
  btVector3 bounds [2];
  btAlignedObjectArray<const_btDbvtNode_*> local_d0;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  undefined1 local_98 [16];
  float *local_88;
  float *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  long local_48;
  ICollide *local_40;
  btVector3 *local_38;
  undefined1 auVar24 [16];
  
  if (root != (btDbvtNode *)0x0) {
    fVar17 = rayTo->m_floats[2] - rayFrom->m_floats[2];
    local_58._0_4_ = (float)*(undefined8 *)rayTo->m_floats - (float)*(undefined8 *)rayFrom->m_floats
    ;
    local_58._4_4_ =
         (float)((ulong)*(undefined8 *)rayTo->m_floats >> 0x20) -
         (float)((ulong)*(undefined8 *)rayFrom->m_floats >> 0x20);
    _fStack_50 = 0;
    local_98._0_4_ =
         fVar17 * fVar17 +
         (float)local_58._0_4_ * (float)local_58._0_4_ +
         (float)local_58._4_4_ * (float)local_58._4_4_;
    if ((float)local_98._0_4_ < 0.0) {
      local_98._0_4_ = sqrtf((float)local_98._0_4_);
    }
    else {
      local_98._0_4_ = SQRT((float)local_98._0_4_);
    }
    local_a0 = (float *)CONCAT44(local_a0._4_4_,rayTo->m_floats[0] - rayFrom->m_floats[0]);
    local_b0 = (float *)CONCAT44(local_b0._4_4_,rayTo->m_floats[1] - rayFrom->m_floats[1]);
    local_a8 = (float *)CONCAT44(local_a8._4_4_,rayTo->m_floats[2] - rayFrom->m_floats[2]);
    local_d0.m_ownsMemory = true;
    local_d0.m_data = (btDbvtNode **)0x0;
    local_d0.m_size = 0;
    local_d0.m_capacity = 0;
    ppbVar5 = (btDbvtNode **)btAlignedAllocInternal(0x400,0x10);
    if (0 < (long)local_d0.m_size) {
      lVar6 = 0;
      do {
        ppbVar5[lVar6] = local_d0.m_data[lVar6];
        lVar6 = lVar6 + 1;
      } while (local_d0.m_size != lVar6);
    }
    if ((local_d0.m_data != (btDbvtNode **)0x0) && (local_d0.m_ownsMemory == true)) {
      btAlignedFreeInternal(local_d0.m_data);
    }
    local_98._0_4_ = 1.0 / (float)local_98._0_4_;
    fVar17 = fVar17 * (float)local_98._0_4_;
    local_58._0_4_ = (float)local_58._0_4_ * (float)local_98._0_4_;
    local_58._4_4_ = (float)local_58._4_4_ * (float)local_98._0_4_;
    auVar16._4_4_ = local_58._4_4_;
    auVar16._0_4_ = local_58._0_4_;
    auVar16._8_4_ = fStack_50 * (float)local_98._0_4_;
    auVar16._12_4_ = fStack_4c * (float)local_98._0_4_;
    auVar16 = divps(_DAT_001f53f0,auVar16);
    auVar23._0_8_ =
         CONCAT44(-(uint)((float)local_58._4_4_ == 0.0),-(uint)((float)local_58._0_4_ == 0.0)) &
         0x5d5e0b6b5d5e0b6b;
    auVar23._8_8_ = 0;
    auVar2._4_4_ = ~-(uint)((float)local_58._4_4_ == 0.0) & auVar16._4_4_;
    auVar2._0_4_ = ~-(uint)((float)local_58._0_4_ == 0.0) & auVar16._0_4_;
    auVar2._8_4_ = ~-(uint)(fStack_50 * (float)local_98._0_4_ == 0.0) & auVar16._8_4_;
    auVar2._12_4_ = ~-(uint)(fStack_4c * (float)local_98._0_4_ == 0.0) & auVar16._12_4_;
    auVar23 = auVar23 | auVar2;
    fVar20 = (float)(-(uint)(fVar17 == 0.0) & 0x5d5e0b6b |
                    ~-(uint)(fVar17 == 0.0) & (uint)(1.0 / fVar17));
    local_98 = ZEXT416((uint)fVar20);
    fVar15 = (float)local_58._4_4_ * local_b0._0_4_;
    fVar26 = (float)local_58._0_4_ * local_a0._0_4_;
    fVar17 = fVar17 * local_a8._0_4_;
    local_d0.m_ownsMemory = true;
    lVar6 = 0;
    do {
      ppbVar5[lVar6] = (btDbvtNode *)0x0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x80);
    _local_58 = auVar23;
    local_d0.m_capacity = 0x80;
    local_d0.m_size = 0x80;
    *ppbVar5 = root;
    pfVar7 = (float *)(&local_78 + (ulong)(auVar23._0_4_ < 0.0) * 2);
    pfVar8 = (float *)(&local_78 + (ulong)(0.0 <= auVar23._0_4_) * 2);
    local_a0 = (float *)((long)&local_78 + (ulong)(auVar23._4_4_ < 0.0) * 0x10 + 4);
    local_b0 = (float *)(&uStack_70 + (ulong)(fVar20 < 0.0) * 2);
    local_a8 = (float *)(&uStack_70 + (ulong)(0.0 <= fVar20) * 2);
    iVar11 = 1;
    iVar10 = 0x7e;
    local_40 = policy;
    local_38 = rayFrom;
    local_d0.m_data = ppbVar5;
    local_88 = pfVar8;
    local_80 = pfVar7;
    do {
      iVar3 = local_d0.m_size;
      iVar12 = iVar11 + -1;
      pbVar1 = local_d0.m_data[(long)iVar11 + -1];
      local_78 = *(undefined8 *)(pbVar1->volume).mi.m_floats;
      uStack_70 = *(undefined8 *)((pbVar1->volume).mi.m_floats + 2);
      local_68 = *(undefined8 *)(pbVar1->volume).mx.m_floats;
      uStack_60 = *(undefined8 *)((pbVar1->volume).mx.m_floats + 2);
      fVar22 = (float)*(undefined8 *)rayFrom->m_floats;
      fVar19 = (float)((ulong)*(undefined8 *)rayFrom->m_floats >> 0x20);
      fVar18 = (*pfVar7 - fVar22) * (float)local_58._0_4_;
      fVar20 = (*(float *)((long)&local_78 + (ulong)(0.0 <= auVar23._4_4_) * 0x10 + 4) - fVar19) *
               (float)local_58._4_4_;
      if (fVar18 <= fVar20) {
        fVar21 = (*pfVar8 - fVar22) * (float)local_58._0_4_;
        fVar22 = (*local_a0 - fVar19) * (float)local_58._4_4_;
        if (fVar22 <= fVar21) {
          iVar13 = -(uint)(fVar18 < fVar22);
          iVar14 = -(uint)(fVar20 < fVar21);
          auVar25._4_4_ = iVar14;
          auVar25._0_4_ = iVar13;
          auVar25._8_4_ = iVar14;
          auVar25._12_4_ = iVar14;
          auVar24._8_8_ = auVar25._8_8_;
          auVar24._4_4_ = iVar13;
          auVar24._0_4_ = iVar13;
          uVar4 = movmskpd((int)local_a0,auVar24);
          if ((uVar4 & 1) == 0) {
            fVar22 = fVar18;
          }
          if ((uVar4 & 2) == 0) {
            fVar20 = fVar21;
          }
          fVar19 = (*local_a8 - rayFrom->m_floats[2]) * (float)local_98._0_4_;
          if ((fVar22 <= fVar19) &&
             (fVar18 = (*local_b0 - rayFrom->m_floats[2]) * (float)local_98._0_4_, fVar18 <= fVar20)
             ) {
            if (fVar18 <= fVar22) {
              fVar18 = fVar22;
            }
            if (fVar18 < fVar17 + fVar26 + fVar15) {
              if (fVar20 <= fVar19) {
                fVar19 = fVar20;
              }
              if (0.0 < fVar19) {
                if ((pbVar1->field_2).childs[1] == (btDbvtNode *)0x0) {
                  (*policy->_vptr_ICollide[3])(policy,pbVar1);
                  pfVar7 = local_80;
                  pfVar8 = local_88;
                  rayFrom = local_38;
                }
                else {
                  if (iVar10 < iVar12) {
                    lVar9 = (long)local_d0.m_size;
                    lVar6 = lVar9 * 2;
                    iVar10 = (int)lVar6;
                    if (local_d0.m_size <= iVar10) {
                      if ((local_d0.m_size < iVar10) && (local_d0.m_capacity < iVar10)) {
                        local_48 = lVar6;
                        if (local_d0.m_size == 0) {
                          ppbVar5 = (btDbvtNode **)0x0;
                        }
                        else {
                          ppbVar5 = (btDbvtNode **)btAlignedAllocInternal(lVar9 << 4,0x10);
                        }
                        if (0 < (long)local_d0.m_size) {
                          lVar6 = 0;
                          do {
                            ppbVar5[lVar6] = local_d0.m_data[lVar6];
                            lVar6 = lVar6 + 1;
                          } while (local_d0.m_size != lVar6);
                        }
                        if ((local_d0.m_data != (btDbvtNode **)0x0) &&
                           (local_d0.m_ownsMemory == true)) {
                          btAlignedFreeInternal(local_d0.m_data);
                        }
                        local_d0.m_ownsMemory = true;
                        local_d0.m_capacity = (int)local_48;
                        lVar6 = local_48;
                        local_d0.m_data = ppbVar5;
                      }
                      if (iVar3 < (int)lVar6) {
                        do {
                          local_d0.m_data[lVar9] = (btDbvtNode *)0x0;
                          lVar9 = lVar9 + 1;
                        } while ((int)lVar6 != lVar9);
                      }
                    }
                    local_d0.m_size = (int)lVar6;
                    iVar10 = local_d0.m_size + -2;
                    policy = local_40;
                  }
                  local_d0.m_data[(long)iVar11 + -1] = (pbVar1->field_2).childs[0];
                  local_d0.m_data[iVar11] = (pbVar1->field_2).childs[1];
                  pfVar7 = local_80;
                  pfVar8 = local_88;
                  iVar12 = iVar11 + 1;
                }
              }
            }
          }
        }
      }
      iVar11 = iVar12;
    } while (iVar11 != 0);
    btAlignedObjectArray<const_btDbvtNode_*>::~btAlignedObjectArray(&local_d0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::rayTest(	const btDbvtNode* root,
								const btVector3& rayFrom,
								const btVector3& rayTo,
								DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
		if(root)
		{
			btVector3 rayDir = (rayTo-rayFrom);
			rayDir.normalize ();

			///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
			btVector3 rayDirectionInverse;
			rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[0];
			rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[1];
			rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[2];
			unsigned int signs[3] = { rayDirectionInverse[0] < 0.0, rayDirectionInverse[1] < 0.0, rayDirectionInverse[2] < 0.0};

			btScalar lambda_max = rayDir.dot(rayTo-rayFrom);

			btVector3 resultNormal;

			btAlignedObjectArray<const btDbvtNode*>	stack;

			int								depth=1;
			int								treshold=DOUBLE_STACKSIZE-2;

			stack.resize(DOUBLE_STACKSIZE);
			stack[0]=root;
			btVector3 bounds[2];
			do	{
				const btDbvtNode*	node=stack[--depth];

				bounds[0] = node->volume.Mins();
				bounds[1] = node->volume.Maxs();
				
				btScalar tmin=1.f,lambda_min=0.f;
				unsigned int result1 = btRayAabb2(rayFrom,rayDirectionInverse,signs,bounds,tmin,lambda_min,lambda_max);

#ifdef COMPARE_BTRAY_AABB2
				btScalar param=1.f;
				bool result2 = btRayAabb(rayFrom,rayTo,node->volume.Mins(),node->volume.Maxs(),param,resultNormal);
				btAssert(result1 == result2);
#endif //TEST_BTRAY_AABB2

				if(result1)
				{
					if(node->isinternal())
					{
						if(depth>treshold)
						{
							stack.resize(stack.size()*2);
							treshold=stack.size()-2;
						}
						stack[depth++]=node->childs[0];
						stack[depth++]=node->childs[1];
					}
					else
					{
						policy.Process(node);
					}
				}
			} while(depth);

		}
}